

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O2

void __thiscall CfgNode::BlockData::clearInstructions(BlockData *this)

{
  std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::clear(&this->m_instrs);
  this->m_size = 0;
  return;
}

Assistant:

void CfgNode::BlockData::clearInstructions() {
	m_instrs.clear();
	m_size = 0;
}